

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneBspTree::initialize(QGraphicsSceneBspTree *this,QRectF *rect,int depth,int index)

{
  int iVar1;
  pointer pNVar2;
  Type TVar3;
  long in_FS_OFFSET;
  bool bVar4;
  qreal qVar5;
  double dVar6;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = QList<QGraphicsSceneBspTree::Node>::data(&this->nodes);
  pNVar2 = pNVar2 + index;
  if (index == 0) {
    pNVar2->type = Horizontal;
    (pNVar2->field_0).offset = rect->h * 0.5 + rect->yp;
  }
  if (depth == 0) {
    pNVar2->type = Leaf;
    iVar1 = this->leafCnt;
    this->leafCnt = iVar1 + 1;
    (pNVar2->field_0).leafIndex = iVar1;
  }
  else {
    bVar4 = pNVar2->type == Horizontal;
    local_58.xp = rect->xp;
    local_58.yp = rect->yp;
    local_78.w = rect->w;
    if (bVar4) {
      local_58.h = rect->h * 0.5;
      local_78.yp = local_58.yp + local_58.h;
      local_78.h = rect->h - local_58.h;
      dVar6 = local_58.xp;
      qVar5 = local_78.w;
      local_78.xp = local_58.xp;
      local_58.w = local_78.w;
    }
    else {
      local_58.w = local_78.w * 0.5;
      local_78.h = rect->h;
      local_78.w = local_78.w - local_58.w;
      dVar6 = local_58.yp;
      local_78.yp = local_58.yp;
      qVar5 = local_78.h;
      local_78.xp = local_58.xp + local_58.w;
      local_58.h = local_78.h;
    }
    TVar3 = (Type)bVar4;
    dVar6 = qVar5 * 0.5 + dVar6;
    iVar1 = index * 2 + 1;
    pNVar2 = QList<QGraphicsSceneBspTree::Node>::data(&this->nodes);
    pNVar2[iVar1].field_0.offset = dVar6;
    pNVar2[iVar1].type = TVar3;
    pNVar2 = QList<QGraphicsSceneBspTree::Node>::data(&this->nodes);
    pNVar2[(long)(index * 2) + 2].field_0.offset = dVar6;
    pNVar2[(long)(index * 2) + 2].type = TVar3;
    initialize(this,&local_58,depth + -1,iVar1);
    initialize(this,&local_78,depth + -1,index * 2 + 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::initialize(const QRectF &rect, int depth, int index)
{
    Node *node = &nodes[index];
    if (index == 0) {
        node->type = Node::Horizontal;
        node->offset = rect.center().y();
    }

    if (depth) {
        Node::Type type;
        QRectF rect1, rect2;
        qreal offset1, offset2;

        if (node->type == Node::Horizontal) {
            type = Node::Vertical;
            rect1.setRect(rect.left(), rect.top(), rect.width(), rect.height() / 2);
            rect2.setRect(rect1.left(), rect1.bottom(), rect1.width(), rect.height() - rect1.height());
            offset1 = rect1.center().x();
            offset2 = rect2.center().x();
        } else {
            type = Node::Horizontal;
            rect1.setRect(rect.left(), rect.top(), rect.width() / 2, rect.height());
            rect2.setRect(rect1.right(), rect1.top(), rect.width() - rect1.width(), rect1.height());
            offset1 = rect1.center().y();
            offset2 = rect2.center().y();
        }

        int childIndex = firstChildIndex(index);

        Node *child = &nodes[childIndex];
        child->offset = offset1;
        child->type = type;

        child = &nodes[childIndex + 1];
        child->offset = offset2;
        child->type = type;

        initialize(rect1, depth - 1, childIndex);
        initialize(rect2, depth - 1, childIndex + 1);
    } else {
        node->type = Node::Leaf;
        node->leafIndex = leafCnt++;
    }
}